

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O1

void __thiscall
VertexAttrib64Bit::GetVertexAttribTest::checkVertexAttribLdv<2u>
          (GetVertexAttribTest *this,GLuint index,bool *result)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  GLenum err;
  ostream *poVar4;
  GLuint i;
  long lVar5;
  int iVar6;
  bool bVar7;
  GLdouble range;
  vertexAttribute<2U> vertex_attribute;
  stringstream function_name;
  long *local_1f0;
  long local_1e0 [2];
  bool *local_1d0;
  GLdouble local_1c8 [2];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_1d0 = result;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"VertexAttribL",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"dv",2);
  iVar6 = 0;
  while( true ) {
    dVar1 = this->m_min;
    dVar2 = this->m_max;
    lVar5 = 0;
    do {
      uVar3 = (uint)Base::RandomDouble::value;
      bVar7 = 0x1fff < Base::RandomDouble::value;
      Base::RandomDouble::value = Base::RandomDouble::value + 1;
      if (bVar7) {
        Base::RandomDouble::value = 0;
      }
      local_1c8[lVar5] = (double)uVar3 * 0.0001220703125 * (dVar2 - dVar1) + dVar1;
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
    (*(this->super_Base).gl.vertexAttribL2dv)(index,local_1c8);
    err = (*(this->super_Base).gl.getError)();
    std::__cxx11::stringbuf::str();
    glu::checkError(err,(char *)local_1f0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                    ,0x31b);
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0,local_1e0[0] + 1);
    }
    std::__cxx11::stringbuf::str();
    bVar7 = verifyResults(this,local_1c8,2,index,(char *)local_1f0,0x31d);
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0,local_1e0[0] + 1);
    }
    if (!bVar7) break;
    iVar6 = iVar6 + 1;
    if (iVar6 == 0x80) {
LAB_009ff5b5:
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      return;
    }
  }
  *local_1d0 = false;
  goto LAB_009ff5b5;
}

Assistant:

void GetVertexAttribTest::checkVertexAttribLdv(GLuint index, bool& result) const
{
	std::stringstream function_name;

	function_name << "VertexAttribL" << SIZE << "dv";

	for (GLuint i = 0; i < m_n_iterations; ++i)
	{
		vertexAttribute<SIZE> vertex_attribute(m_min, m_max);

		vertexAttribLdv<SIZE>(index, vertex_attribute);
		GLU_EXPECT_NO_ERROR(gl.getError(), function_name.str().c_str());

		if (false == verifyResults(vertex_attribute.m_array, SIZE, index, function_name.str().c_str(), __LINE__))
		{
			result = false;
			return;
		}
	}
}